

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O3

_Bool cfg_loads(char *json,size_t len,config_item *items)

{
  _Bool _Var1;
  json_value *value;
  json_settings settings;
  json_settings local_48;
  
  local_48.max_memory = 0;
  local_48.user_data = (void *)0x0;
  local_48.value_extra = 0;
  local_48.mem_alloc = (_func_void_ptr_size_t_int_void_ptr *)0x0;
  local_48.mem_free = (_func_void_void_ptr_void_ptr *)0x0;
  local_48.settings = 1;
  local_48._12_4_ = 0;
  value = json_parse_ex(&local_48,json,len,(char *)0x0);
  if (items == (config_item *)0x0) {
    _Var1 = true;
  }
  else if (value == (json_value *)0x0) {
    _Var1 = false;
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",0x2c,
               "cfg_loads",0,3,"Failed to parse JSON content!");
  }
  else {
    if (value->type == json_object) {
      _Var1 = cfg_parse_simple_object(value,items);
    }
    else {
      _Var1 = false;
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",0x34,
                 "cfg_loads",0,3,"Only Object is accepted as JSON config root!");
    }
    json_value_free(value);
  }
  return _Var1;
}

Assistant:

bool cfg_loads(const char * json, size_t len, config_item *items)
{
    bool rc = false;
    json_settings settings = { 0 };
    settings.settings = json_enable_comments;
    json_value* value = json_parse_ex(&settings, json, len, 0);
    
    if (items == NULL)
        // No config item to be processed
        return true;

    if (value == NULL)
    {
        log_error(LOG_ERR, "Failed to parse JSON content!");
        return false;
    }
    // I want root is object only
    rc = value->type == json_object;
    if (rc)
        rc = cfg_parse_simple_object(value, items);
    else
        log_error(LOG_ERR, "Only Object is accepted as JSON config root!");
    json_value_free(value);
    return rc;
}